

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

int Curl_blockread_all(connectdata *conn,curl_socket_t sockfd,char *buf,ssize_t buffersize,
                      ssize_t *n)

{
  int iVar1;
  CURLcode CVar2;
  long timeout_ms;
  ssize_t nread;
  long local_48;
  long local_38;
  
  *n = 0;
  local_48 = 0;
  while( true ) {
    do {
      timeout_ms = Curl_timeleft(conn->data,(timeval *)0x0,true);
      if (timeout_ms < 0) {
        return 0x1c;
      }
      iVar1 = Curl_socket_check(sockfd,-1,-1,timeout_ms);
      if (iVar1 < 1) {
        return -1;
      }
      CVar2 = Curl_read_plain(sockfd,buf,buffersize,&local_38);
    } while (CVar2 == CURLE_AGAIN);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    buffersize = buffersize - local_38;
    if (buffersize == 0) break;
    if (local_38 == 0) {
      return -1;
    }
    buf = buf + local_38;
    local_48 = local_48 + local_38;
  }
  *n = local_38 + local_48;
  return 0;
}

Assistant:

int Curl_blockread_all(struct connectdata *conn, /* connection data */
                       curl_socket_t sockfd,     /* read from this socket */
                       char *buf,                /* store read data here */
                       ssize_t buffersize,       /* max amount to read */
                       ssize_t *n)               /* amount bytes read */
{
  ssize_t nread;
  ssize_t allread = 0;
  int result;
  long timeleft;
  *n = 0;
  for(;;) {
    timeleft = Curl_timeleft(conn->data, NULL, TRUE);
    if(timeleft < 0) {
      /* we already got the timeout */
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    }
    if(Curl_socket_ready(sockfd, CURL_SOCKET_BAD, timeleft) <= 0) {
      result = ~CURLE_OK;
      break;
    }
    result = Curl_read_plain(sockfd, buf, buffersize, &nread);
    if(CURLE_AGAIN == result)
      continue;
    else if(result)
      break;

    if(buffersize == nread) {
      allread += nread;
      *n = allread;
      result = CURLE_OK;
      break;
    }
    if(!nread) {
      result = ~CURLE_OK;
      break;
    }

    buffersize -= nread;
    buf += nread;
    allread += nread;
  }
  return result;
}